

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapOutput.c
# Opt level: O0

Amap_Out_t * Amap_OutputStructAlloc(Aig_MmFlex_t *pMem,Amap_Gat_t *pGate)

{
  Amap_Out_t *__s;
  char *local_30;
  uint local_28;
  int nFans;
  Amap_Out_t *pRes;
  Amap_Gat_t *pGate_local;
  Aig_MmFlex_t *pMem_local;
  
  if (pGate == (Amap_Gat_t *)0x0) {
    local_28 = 1;
  }
  else {
    local_28 = *(uint *)&pGate->field_0x38 >> 0x18;
  }
  __s = (Amap_Out_t *)Aig_MmFlexEntryFetch(pMem,local_28 * 4 + 0x10);
  memset(__s,0,0x10);
  memset(&__s->field_0xc,0xff,(long)(int)local_28 << 2);
  if (pGate == (Amap_Gat_t *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = Amap_OuputStrsav(pMem,pGate->pName);
  }
  __s->pName = local_30;
  __s->nFans = (short)local_28;
  return __s;
}

Assistant:

Amap_Out_t * Amap_OutputStructAlloc( Aig_MmFlex_t * pMem, Amap_Gat_t * pGate )
{
    Amap_Out_t * pRes;
    int nFans = pGate? pGate->nPins : 1;
    pRes = (Amap_Out_t *)Aig_MmFlexEntryFetch( pMem, sizeof(Amap_Out_t)+sizeof(int)*nFans );
    memset( pRes, 0, sizeof(Amap_Out_t) );
    memset( pRes->pFans, 0xff, sizeof(int)*nFans );
    pRes->pName = pGate? Amap_OuputStrsav( pMem, pGate->pName ) : NULL;
    pRes->nFans = nFans;
    return pRes;
}